

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getF0(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  EAMAdapter *in_stack_ffffffffffffffa8;
  undefined8 local_10;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_10);
  return (RealType)local_10;
}

Assistant:

RealType EAMAdapter::getF0() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.F0;
  }